

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsp_header.cpp
# Opt level: O1

lsp_header * lscpp::parse_header(lsp_header *__return_storage_ptr__,transporter *t)

{
  int iVar1;
  long *__nptr;
  int iVar2;
  Verbosity VVar3;
  int *piVar4;
  long *plVar5;
  undefined8 uVar6;
  long *plVar7;
  double __x;
  double __x_00;
  string line;
  long *local_80 [2];
  long local_70 [2];
  long *local_60;
  long local_58;
  long local_50 [2];
  transporter *local_40;
  long *local_38;
  
  (*((t->impl_)._M_t.
     super___uniq_ptr_impl<lscpp::transporter::iface,_std::default_delete<lscpp::transporter::iface>_>
     ._M_t.
     super__Tuple_impl<0UL,_lscpp::transporter::iface_*,_std::default_delete<lscpp::transporter::iface>_>
     .super__Head_base<0UL,_lscpp::transporter::iface_*,_false>._M_head_impl)->_vptr_iface[2])
            (&local_60);
  std::__cxx11::string::substr((ulong)local_80,(ulong)&local_60);
  iVar2 = std::__cxx11::string::compare((char *)local_80);
  plVar7 = local_70;
  if (local_80[0] != plVar7) {
    operator_delete(local_80[0],local_70[0] + 1);
  }
  if (iVar2 == 0) {
    local_40 = t;
    std::__cxx11::string::substr((ulong)local_80,(ulong)&local_60);
    __nptr = local_80[0];
    piVar4 = __errno_location();
    iVar1 = *piVar4;
    *piVar4 = 0;
    plVar5 = (long *)strtol((char *)__nptr,(char **)&local_38,10);
    t = local_40;
    if (local_38 == __nptr) {
      std::__throw_invalid_argument("stoi");
    }
    else {
      plVar7 = plVar5;
      if (((long *)(long)(int)plVar5 == plVar5) && (*piVar4 != 0x22)) {
        if (*piVar4 == 0) {
          *piVar4 = iVar1;
        }
        if (local_80[0] != local_70) {
          operator_delete(local_80[0],local_70[0] + 1);
        }
        goto LAB_001448a9;
      }
    }
    uVar6 = std::__throw_out_of_range("stoi");
    if (local_80[0] != plVar7) {
      operator_delete(local_80[0],local_70[0] + 1);
    }
    if (local_60 != local_50) {
      operator_delete(local_60,local_50[0] + 1);
    }
    _Unwind_Resume(uVar6);
  }
  VVar3 = loguru::current_verbosity_cutoff();
  if (-3 < VVar3) {
    __x = (double)std::__cxx11::string::substr((ulong)local_80,(ulong)&local_60);
    loguru::log(__x);
    if (local_80[0] != plVar7) {
      operator_delete(local_80[0],local_70[0] + 1);
    }
  }
  __return_storage_ptr__->content_length = -1;
  (__return_storage_ptr__->content_type).
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  plVar5 = plVar7;
LAB_001448a9:
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  if (iVar2 == 0) {
    (*((t->impl_)._M_t.
       super___uniq_ptr_impl<lscpp::transporter::iface,_std::default_delete<lscpp::transporter::iface>_>
       ._M_t.
       super__Tuple_impl<0UL,_lscpp::transporter::iface_*,_std::default_delete<lscpp::transporter::iface>_>
       .super__Head_base<0UL,_lscpp::transporter::iface_*,_false>._M_head_impl)->_vptr_iface[2])
              (&local_60);
    if (local_58 == 0) {
      __return_storage_ptr__->content_length = (int)plVar5;
      (__return_storage_ptr__->content_type).
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
      if (local_60 != local_50) {
        operator_delete(local_60,local_50[0] + 1);
      }
    }
    else {
      if (local_60 != local_50) {
        operator_delete(local_60,local_50[0] + 1);
      }
      VVar3 = loguru::current_verbosity_cutoff();
      if (-3 < VVar3) {
        loguru::log(__x_00);
      }
      __return_storage_ptr__->content_length = -1;
      (__return_storage_ptr__->content_type).
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

lsp_header parse_header(transporter &t) {
  int content_length;
  if (auto line = t.read_line();
      line.substr(0, 16).compare("Content-Length: ") == 0) {
    content_length = std::stoi(line.substr(16, std::string::npos));
  } else {
    LOG_F(ERROR,
          "Failed parsing header, got '%s' instead of 'Content-Length: '",
          line.substr(0, 16).c_str());
    return {-1}; // TODO return a proper error on failure.
  }

  if (auto line = t.read_line(); line.size() == 0) // a new line
    return {content_length};                       // valid header

  LOG_F(ERROR, "Failed parsing header!");
  return {-1};
}